

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu.cpp
# Opt level: O0

int __thiscall ncnn::PReLU::forward_inplace(PReLU *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  Mat *in_RSI;
  long in_RDI;
  int i_3;
  float slope_2;
  float *ptr_2;
  int q;
  int size;
  int channels;
  int h_1;
  int w_2;
  int j;
  float slope_1;
  float *ptr_1;
  int i_2;
  int h;
  int w_1;
  int i_1;
  float slope;
  int i;
  float *ptr;
  int w;
  int dims;
  float local_e4;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff28;
  float local_cc;
  int local_bc;
  Mat local_a8;
  Mat *local_70;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  float local_4c;
  float *local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  float local_30;
  int local_2c;
  float *local_28;
  int local_20;
  int local_1c;
  Mat *local_10;
  
  local_1c = in_RSI->dims;
  local_10 = in_RSI;
  if (local_1c == 1) {
    local_20 = in_RSI->w;
    local_28 = Mat::operator_cast_to_float_(in_RSI);
    if (*(int *)(in_RDI + 0x80) < 2) {
      pfVar1 = Mat::operator[]((Mat *)(in_RDI + 0x88),0);
      local_30 = *pfVar1;
      for (local_34 = 0; local_34 < local_20; local_34 = local_34 + 1) {
        if (local_28[local_34] <= 0.0 && local_28[local_34] != 0.0) {
          local_28[local_34] = local_30 * local_28[local_34];
        }
      }
    }
    else {
      for (local_2c = 0; local_2c < local_20; local_2c = local_2c + 1) {
        if (local_28[local_2c] <= 0.0 && local_28[local_2c] != 0.0) {
          pfVar1 = Mat::operator[]((Mat *)(in_RDI + 0x88),local_2c);
          local_28[local_2c] = *pfVar1 * local_28[local_2c];
        }
      }
    }
  }
  if (local_1c == 2) {
    local_38 = local_10->w;
    local_3c = local_10->h;
    for (local_40 = 0; local_40 < local_3c; local_40 = local_40 + 1) {
      local_48 = Mat::row(local_10,local_40);
      if (*(int *)(in_RDI + 0x80) < 2) {
        pfVar1 = Mat::operator[]((Mat *)(in_RDI + 0x88),0);
        local_cc = *pfVar1;
      }
      else {
        pfVar1 = Mat::operator[]((Mat *)(in_RDI + 0x88),local_40);
        local_cc = *pfVar1;
      }
      local_4c = local_cc;
      for (local_50 = 0; local_50 < local_38; local_50 = local_50 + 1) {
        if (local_48[local_50] <= 0.0 && local_48[local_50] != 0.0) {
          local_48[local_50] = local_cc * local_48[local_50];
        }
      }
    }
  }
  if (local_1c == 3) {
    local_54 = local_10->w;
    local_58 = local_10->h;
    local_5c = local_10->c;
    local_60 = local_54 * local_58;
    for (local_64 = 0; local_64 < local_5c; local_64 = local_64 + 1) {
      this_00 = &local_a8;
      Mat::channel(in_stack_ffffffffffffff28,(int)((ulong)this_00 >> 0x20));
      in_stack_ffffffffffffff28 = (Mat *)Mat::operator_cast_to_float_(this_00);
      Mat::~Mat((Mat *)0x122802);
      local_70 = in_stack_ffffffffffffff28;
      if (*(int *)(in_RDI + 0x80) < 2) {
        pfVar1 = Mat::operator[]((Mat *)(in_RDI + 0x88),0);
        local_e4 = *pfVar1;
      }
      else {
        pfVar1 = Mat::operator[]((Mat *)(in_RDI + 0x88),local_64);
        local_e4 = *pfVar1;
      }
      for (local_bc = 0; local_bc < local_60; local_bc = local_bc + 1) {
        pfVar1 = (float *)((long)&local_70->data + (long)local_bc * 4);
        if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
          *(float *)((long)&local_70->data + (long)local_bc * 4) =
               local_e4 * *(float *)((long)&local_70->data + (long)local_bc * 4);
        }
      }
    }
  }
  return 0;
}

Assistant:

int PReLU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        if (num_slope > 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<w; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float slope = slope_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<w; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];

            for (int j=0; j<w; j++)
            {
                if (ptr[j] < 0)
                    ptr[j] *= slope;
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];

            for (int i=0; i<size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    return 0;
}